

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void FXSHFT(int NN,int L2,double *ZR,double *ZI,int *CONV,double *SR,double *SI,double *PR,
           double *PI,double *QPR,double *QPI,double *PVR,double *PVI,double ARE,double MRE,
           double ETA,double INFIN,double *HR,double *HI,double *QHR,double *QHI,double *SHR,
           double *SHI,double *TR,double *TI)

{
  double dVar1;
  double dVar2;
  double local_c0;
  double tp2;
  double tp1;
  int i;
  int j;
  int BOOL;
  int PASD;
  int TEST;
  int N;
  double SVSI;
  double SVSR;
  double OTI;
  double OTR;
  double INFIN_local;
  double ETA_local;
  double MRE_local;
  double ARE_local;
  double *SR_local;
  int *CONV_local;
  double *ZI_local;
  double *ZR_local;
  int L2_local;
  int NN_local;
  
  PASD = NN + -1;
  OTR = INFIN;
  INFIN_local = ETA;
  ETA_local = MRE;
  MRE_local = ARE;
  ARE_local = (double)SR;
  SR_local = (double *)CONV;
  CONV_local = (int *)ZI;
  ZI_local = ZR;
  ZR_local._0_4_ = L2;
  ZR_local._4_4_ = NN;
  POLYEV(NN,SR,SI,PR,PI,QPR,QPI,PVR,PVI);
  BOOL = 1;
  j = 0;
  CALCT(&i,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,OTR,PVR,PVI,TR,TI);
  for (tp1._4_4_ = 0; tp1._4_4_ < (int)ZR_local; tp1._4_4_ = tp1._4_4_ + 1) {
    OTI = *TR;
    SVSR = *TI;
    NEXTH(&i,ZR_local._4_4_,QHR,QHI,QPR,QPI,TR,TI,HR,HI);
    CALCT(&i,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,OTR,PVR,PVI,TR,TI);
    *ZI_local = *(double *)ARE_local + *TR;
    *(double *)CONV_local = *SI + *TI;
    if (((i != 1) && (BOOL != 0)) && (tp1._4_4_ != (int)ZR_local + -1)) {
      tp2 = *TR - OTI;
      local_c0 = *TI - SVSR;
      dVar1 = CMOD(&tp2,&local_c0);
      dVar2 = CMOD(ZI_local,(double *)CONV_local);
      if (dVar2 * 0.5 <= dVar1) {
        j = 0;
      }
      else if (j == 1) {
        for (tp1._0_4_ = 0; tp1._0_4_ < PASD; tp1._0_4_ = tp1._0_4_ + 1) {
          SHR[tp1._0_4_] = HR[tp1._0_4_];
          SHI[tp1._0_4_] = HI[tp1._0_4_];
        }
        SVSI = *(double *)ARE_local;
        _TEST = *SI;
        VRSHFT(ZR_local._4_4_,10,ZI_local,(double *)CONV_local,(int *)SR_local,(double *)ARE_local,
               SI,PR,PI,QPR,QPI,PVR,PVI,MRE_local,ETA_local,INFIN_local,OTR,HR,HI,QHR,QHI,SHR,SHI,TR
               ,TI);
        if (*(int *)SR_local == 1) break;
        BOOL = 0;
        for (tp1._0_4_ = 0; tp1._0_4_ < PASD; tp1._0_4_ = tp1._0_4_ + 1) {
          HR[tp1._0_4_] = SHR[tp1._0_4_];
          HI[tp1._0_4_] = SHI[tp1._0_4_];
        }
        *(double *)ARE_local = SVSI;
        *SI = _TEST;
        POLYEV(ZR_local._4_4_,(double *)ARE_local,SI,PR,PI,QPR,QPI,PVR,PVI);
        CALCT(&i,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,OTR,PVR,PVI,TR,TI);
      }
      else {
        j = 1;
      }
    }
  }
  VRSHFT(ZR_local._4_4_,10,ZI_local,(double *)CONV_local,(int *)SR_local,(double *)ARE_local,SI,PR,
         PI,QPR,QPI,PVR,PVI,MRE_local,ETA_local,INFIN_local,OTR,HR,HI,QHR,QHI,SHR,SHI,TR,TI);
  return;
}

Assistant:

static void FXSHFT(int NN, int L2, double *ZR, double *ZI, int *CONV, double *SR, double *SI, double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/* 
	C COMPUTES L2 FIXED-SHIFT H POLYNOMIALS AND TESTS FOR
	C CONVERGENCE.
	C INITIATES A VARIABLE-SHIFT ITERATION AND RETURNS WITH THE
	C APPROXIMATE ZERO IF SUCCESSFUL.
	C L2 - LIMIT OF FIXED SHIFT STEPS
	C ZR,ZI - APPROXIMATE ZERO IF CONV IS .TRUE.
	C CONV  - LOGICAL INDICATING CONVERGENCE OF STAGE 3 ITERATION
	*/
	double OTR, OTI, SVSR, SVSI;
	int N, TEST, PASD, BOOL,j,i;
	double tp1, tp2;
	N = NN - 1;
	
	POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
	TEST = 1;
	PASD = 0;
	CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
	for (j = 0; j < L2; ++j) {
		OTR = *TR;
		OTI = *TI;
		NEXTH(&BOOL, NN, QHR, QHI, QPR, QPI, TR, TI, HR, HI);
		CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
		//printf("\n S %g %g", *SR, *SI);
		*ZR = *SR + *TR;
		*ZI = *SI + *TI;
		if (!(BOOL == 1 || TEST == 0 || j == L2 - 1)) {
			tp1 = *TR - OTR;
			tp2 = *TI - OTI;
			if (CMOD(&tp1, &tp2) < 0.5*CMOD(ZR, ZI)) {
				if (PASD == 1) {
					for (i = 0; i < N; ++i) {
						SHR[i] = HR[i];
						SHI[i] = HI[i];
					}
					SVSR = *SR;
					SVSI = *SI;
					VRSHFT(NN, 10, ZR, ZI, CONV, SR, SI, PR, PI, QPR, QPI, PVR, PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, TR, TI);
					if (*CONV == 1) {
						break; //C THE ITERATION FAILED TO CONVERGE. TURN OFF TESTING AND RESTORE
					}
					TEST = 0;
					for (i = 0; i < N; ++i) {
						HR[i] = SHR[i];
						HI[i] = SHI[i];
					}
					*SR = SVSR;
					*SI = SVSI;
					POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
					CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
				}
				else {
					PASD = 1;
				}

			} else {
				PASD = 0;
			}
		}
	}

	VRSHFT(NN, 10, ZR, ZI, CONV, SR, SI, PR, PI, QPR, QPI, PVR, PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, TR, TI);
}